

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O0

JsonLexer * __thiscall
json::JsonLexer::readNumber_abi_cxx11_(JsonLexer *this,istream *input,char previous)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  runtime_error *this_00;
  JsonLexer local_b0 [32];
  JsonLexer local_90 [32];
  JsonLexer local_70 [32];
  JsonLexer local_50 [53];
  char local_1b;
  undefined1 local_1a;
  char local_19;
  char c;
  istream *piStack_18;
  char previous_local;
  istream *input_local;
  string *number;
  
  local_1a = 0;
  local_19 = previous;
  piStack_18 = input;
  input_local = (istream *)this;
  std::__cxx11::string::string((string *)this);
  local_1b = local_19;
  if (local_19 == '-') {
    std::__cxx11::string::operator+=((string *)this,'-');
    plVar3 = (long *)std::istream::get((char *)piStack_18);
    bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (((bVar1 & 1) != 0) || (iVar2 = isdigit((int)local_1b), iVar2 == 0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"After a minus sign there must be at least one digit");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::operator+=((string *)this,local_1b);
  if (local_1b != '0') {
    readDigits_abi_cxx11_(local_50,piStack_18);
    std::__cxx11::string::operator+=((string *)this,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) == 0) {
    local_1b = std::istream::peek();
    if (local_1b == '.') {
      readFraction_abi_cxx11_(local_70,piStack_18);
      std::__cxx11::string::operator+=((string *)this,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      bVar1 = std::ios::eof();
      if (((bVar1 & 1) == 0) &&
         ((local_1b = std::istream::peek(), local_1b == 'e' || (local_1b == 'E')))) {
        readExponent_abi_cxx11_(local_90,piStack_18);
        std::__cxx11::string::operator+=((string *)this,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
      }
    }
    else if ((local_1b == 'e') || (local_1b == 'E')) {
      readExponent_abi_cxx11_(local_b0,piStack_18);
      std::__cxx11::string::operator+=((string *)this,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
    }
  }
  return this;
}

Assistant:

std::string JsonLexer::readNumber(std::istream &input, char previous)
    {
        std::string number;
        char c = previous;

        // Check for optional minus.
        if (c == '-')
        {
            number += c;
            if (!(input.get(c)) || !isdigit(c))
                throw std::runtime_error("After a minus sign there must be at least one digit");
        }

        number += c;

        // We only want to continue to append digits if the number
        // doesn't start with zero. For example "0123" is not a valid number.
        if (c != '0')
        {
            number += readDigits(input);
        }

        // Check for optional fraction and exponent.
        if (!input.eof())
        {
            c = static_cast<char>(input.peek());
            if (c == '.')
            {
                number += readFraction(input);
                if (!input.eof())
                {
                    c = static_cast<char>(input.peek());
                    if (c == 'e' || c == 'E')
                    {
                        number += readExponent(input);
                    }
                }
            }
            else if (c == 'e' || c == 'E')
            {
                number += readExponent(input);
            }
        }

        return number;
    }